

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O2

size_t absl::lts_20250127::cord_internal::TagToAllocatedSize(uint8_t tag)

{
  sbyte sVar1;
  sbyte sVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000039;
  
  iVar4 = -0xb8000;
  if (tag < 0xbb) {
    iVar4 = -0xe80;
  }
  sVar1 = 0xc;
  if (tag < 0xbb) {
    sVar1 = 6;
  }
  iVar3 = -0x10;
  if (0x42 < tag) {
    iVar3 = iVar4;
  }
  sVar2 = 3;
  if (0x42 < tag) {
    sVar2 = sVar1;
  }
  return (long)(((int)CONCAT71(in_register_00000039,tag) << sVar2) + iVar3);
}

Assistant:

constexpr size_t TagToAllocatedSize(uint8_t tag) {
  return (tag <= kTagBase + 512 / 8) ? tag * 8 - kTagBase * 8
         : (tag <= kTagBase + (512 / 8) + ((8192 - 512) / 64))
             ? 512 + tag * 64 - kTagBase * 64 - 512 / 8 * 64
             : 8192 + tag * 4096 - kTagBase * 4096 -
                   ((512 / 8) + ((8192 - 512) / 64)) * 4096;
}